

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

pair<int,_int>
jsoncons::decode_traits<std::pair<int,int>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  
  (*cursor->_vptr_basic_staj_cursor[2])(cursor,ec);
  if (ec->_M_value == 0) {
    iVar1 = (*cursor->_vptr_basic_staj_cursor[4])(cursor);
    if (*(char *)CONCAT44(extraout_var,iVar1) == '\x0e') {
      (*cursor->_vptr_basic_staj_cursor[8])(cursor,ec);
      if (ec->_M_value == 0) {
        uVar2 = decode_traits<int,char,void>::
                decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                          (cursor,decoder,ec);
        if (ec->_M_value == 0) {
          (*cursor->_vptr_basic_staj_cursor[8])(cursor,ec);
          if (ec->_M_value == 0) {
            uVar3 = decode_traits<int,char,void>::
                    decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                              (cursor,decoder,ec);
            if (ec->_M_value == 0) {
              (*cursor->_vptr_basic_staj_cursor[8])(cursor,ec);
              iVar1 = (*cursor->_vptr_basic_staj_cursor[4])(cursor);
              if (*(char *)CONCAT44(extraout_var_00,iVar1) == '\x0f') {
                uVar5 = (ulong)uVar3 << 0x20;
                uVar4 = (ulong)uVar2;
                goto LAB_001dcda7;
              }
              goto LAB_001dcd97;
            }
          }
        }
      }
    }
    else {
LAB_001dcd97:
      std::error_code::operator=(ec,not_pair);
    }
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_001dcda7:
  return (pair<int,_int>)(uVar4 | uVar5);
}

Assistant:

static std::pair<T1, T2> decode(basic_staj_cursor<CharT>& cursor,
            json_decoder<Json, TempAllocator>& decoder,
            std::error_code& ec)
        {
            using value_type = std::pair<T1, T2>;
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            cursor.next(ec); // skip past array
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type();
            }

            T1 v1 = decode_traits<T1,CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            T2 v2 = decode_traits<T2, CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);

            if (cursor.current().event_type() != staj_event_type::end_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            return std::make_pair(v1, v2);
        }